

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  float *pfVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  RayK<8> *pRVar35;
  byte bVar36;
  byte bVar37;
  int iVar38;
  float *vertices;
  ulong uVar39;
  undefined1 (*pauVar40) [32];
  long lVar41;
  byte bVar42;
  undefined4 uVar43;
  ulong uVar44;
  NodeRef root;
  ulong uVar45;
  ulong *puVar46;
  bool bVar47;
  ulong uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  uint uVar73;
  uint uVar74;
  uint uVar75;
  uint uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar88 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vuint<4> *v;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  byte local_5d59;
  Precalculations local_5d41;
  size_t local_5d40;
  RayK<8> *local_5d38;
  BVH *local_5d30;
  Intersectors *local_5d28;
  RayQueryContext *local_5d20;
  RayK<8> *local_5d18;
  ulong local_5d10;
  ulong local_5d08;
  ulong local_5d00;
  Scene *local_5cf8;
  RTCFilterFunctionNArguments local_5cf0;
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [32];
  undefined8 local_5c80;
  undefined8 uStack_5c78;
  undefined8 local_5c70;
  undefined8 uStack_5c68;
  int local_5c60;
  int iStack_5c5c;
  int iStack_5c58;
  int iStack_5c54;
  int iStack_5c50;
  int iStack_5c4c;
  int iStack_5c48;
  int iStack_5c44;
  undefined1 local_5c40 [32];
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [8];
  float fStack_5b98;
  float fStack_5b94;
  float fStack_5b90;
  float fStack_5b8c;
  float fStack_5b88;
  undefined1 local_5b80 [8];
  float fStack_5b78;
  float fStack_5b74;
  float fStack_5b70;
  float fStack_5b6c;
  float fStack_5b68;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5b60;
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  float local_5a40;
  float fStack_5a3c;
  float fStack_5a38;
  float fStack_5a34;
  float fStack_5a30;
  float fStack_5a2c;
  float fStack_5a28;
  undefined4 uStack_5a24;
  float local_5a20;
  float fStack_5a1c;
  float fStack_5a18;
  float fStack_5a14;
  float fStack_5a10;
  float fStack_5a0c;
  float fStack_5a08;
  undefined4 uStack_5a04;
  undefined1 local_5a00 [32];
  int local_59e0;
  int iStack_59dc;
  int iStack_59d8;
  int iStack_59d4;
  int iStack_59d0;
  int iStack_59cc;
  int iStack_59c8;
  int iStack_59c4;
  uint local_59c0;
  uint uStack_59bc;
  uint uStack_59b8;
  uint uStack_59b4;
  uint uStack_59b0;
  uint uStack_59ac;
  uint uStack_59a8;
  uint uStack_59a4;
  uint local_59a0;
  uint uStack_599c;
  uint uStack_5998;
  uint uStack_5994;
  uint uStack_5990;
  uint uStack_598c;
  uint uStack_5988;
  uint uStack_5984;
  uint local_5980;
  uint uStack_597c;
  uint uStack_5978;
  uint uStack_5974;
  uint uStack_5970;
  uint uStack_596c;
  uint uStack_5968;
  uint uStack_5964;
  undefined1 local_5960 [32];
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 uStack_5910;
  undefined8 uStack_5908;
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  float local_58c0;
  float fStack_58bc;
  float fStack_58b8;
  float fStack_58b4;
  float fStack_58b0;
  float fStack_58ac;
  float fStack_58a8;
  undefined4 uStack_58a4;
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  uint local_5860;
  uint uStack_585c;
  uint uStack_5858;
  uint uStack_5854;
  uint uStack_5850;
  uint uStack_584c;
  uint uStack_5848;
  uint uStack_5844;
  uint local_5840;
  uint uStack_583c;
  uint uStack_5838;
  uint uStack_5834;
  uint uStack_5830;
  uint uStack_582c;
  uint uStack_5828;
  uint uStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  uint local_4660;
  uint uStack_465c;
  uint uStack_4658;
  uint uStack_4654;
  uint uStack_4650;
  uint uStack_464c;
  uint uStack_4648;
  uint uStack_4644;
  undefined1 local_4640 [17936];
  
  local_5d30 = (BVH *)This->ptr;
  if ((local_5d30->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar50 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar49 = ZEXT816(0) << 0x40;
      uVar48 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar49),5);
      uVar45 = vpcmpeqd_avx512vl(auVar50,(undefined1  [32])valid_i->field_0);
      uVar48 = uVar48 & uVar45;
      bVar37 = (byte)uVar48;
      if (bVar37 != 0) {
        local_5b60._0_4_ = *(float *)ray;
        local_5b60._4_4_ = *(float *)(ray + 4);
        local_5b60._8_4_ = *(float *)(ray + 8);
        local_5b60._12_4_ = *(float *)(ray + 0xc);
        local_5b60._16_4_ = *(float *)(ray + 0x10);
        local_5b60._20_4_ = *(float *)(ray + 0x14);
        local_5b60._24_4_ = *(float *)(ray + 0x18);
        local_5b60._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5b60._32_4_ = *(float *)(ray + 0x20);
        local_5b60._36_4_ = *(float *)(ray + 0x24);
        local_5b60._40_4_ = *(float *)(ray + 0x28);
        local_5b60._44_4_ = *(float *)(ray + 0x2c);
        local_5b60._48_4_ = *(float *)(ray + 0x30);
        local_5b60._52_4_ = *(float *)(ray + 0x34);
        local_5b60._56_4_ = *(float *)(ray + 0x38);
        local_5b60._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5b60._64_4_ = *(float *)(ray + 0x40);
        local_5b60._68_4_ = *(float *)(ray + 0x44);
        local_5b60._72_4_ = *(float *)(ray + 0x48);
        local_5b60._76_4_ = *(float *)(ray + 0x4c);
        local_5b60._80_4_ = *(float *)(ray + 0x50);
        local_5b60._84_4_ = *(float *)(ray + 0x54);
        local_5b60._88_4_ = *(float *)(ray + 0x58);
        local_5b60._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_5b00 = *(undefined1 (*) [32])(ray + 0x80);
        local_5ae0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5ac0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar83 = ZEXT3264(auVar50);
        vandps_avx512vl(local_5b00,auVar50);
        auVar51._8_4_ = 0x219392ef;
        auVar51._0_8_ = 0x219392ef219392ef;
        auVar51._12_4_ = 0x219392ef;
        auVar51._16_4_ = 0x219392ef;
        auVar51._20_4_ = 0x219392ef;
        auVar51._24_4_ = 0x219392ef;
        auVar51._28_4_ = 0x219392ef;
        uVar45 = vcmpps_avx512vl(auVar50,auVar51,1);
        bVar47 = (bool)((byte)uVar45 & 1);
        auVar53._0_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5b00._0_4_;
        bVar47 = (bool)((byte)(uVar45 >> 1) & 1);
        auVar53._4_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5b00._4_4_;
        bVar47 = (bool)((byte)(uVar45 >> 2) & 1);
        auVar53._8_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5b00._8_4_;
        bVar47 = (bool)((byte)(uVar45 >> 3) & 1);
        auVar53._12_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5b00._12_4_;
        bVar47 = (bool)((byte)(uVar45 >> 4) & 1);
        auVar53._16_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5b00._16_4_;
        bVar47 = (bool)((byte)(uVar45 >> 5) & 1);
        auVar53._20_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5b00._20_4_;
        bVar47 = (bool)((byte)(uVar45 >> 6) & 1);
        auVar53._24_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5b00._24_4_;
        bVar47 = SUB81(uVar45 >> 7,0);
        auVar53._28_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5b00._28_4_;
        vandps_avx512vl(local_5ae0,auVar50);
        uVar45 = vcmpps_avx512vl(auVar53,auVar51,1);
        bVar47 = (bool)((byte)uVar45 & 1);
        auVar54._0_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ae0._0_4_;
        bVar47 = (bool)((byte)(uVar45 >> 1) & 1);
        auVar54._4_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ae0._4_4_;
        bVar47 = (bool)((byte)(uVar45 >> 2) & 1);
        auVar54._8_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ae0._8_4_;
        bVar47 = (bool)((byte)(uVar45 >> 3) & 1);
        auVar54._12_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ae0._12_4_;
        bVar47 = (bool)((byte)(uVar45 >> 4) & 1);
        auVar54._16_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ae0._16_4_;
        bVar47 = (bool)((byte)(uVar45 >> 5) & 1);
        auVar54._20_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ae0._20_4_;
        bVar47 = (bool)((byte)(uVar45 >> 6) & 1);
        auVar54._24_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ae0._24_4_;
        bVar47 = SUB81(uVar45 >> 7,0);
        auVar54._28_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ae0._28_4_;
        vandps_avx512vl(local_5ac0,auVar50);
        uVar45 = vcmpps_avx512vl(auVar54,auVar51,1);
        bVar47 = (bool)((byte)uVar45 & 1);
        auVar50._0_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ac0._0_4_;
        bVar47 = (bool)((byte)(uVar45 >> 1) & 1);
        auVar50._4_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ac0._4_4_;
        bVar47 = (bool)((byte)(uVar45 >> 2) & 1);
        auVar50._8_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ac0._8_4_;
        bVar47 = (bool)((byte)(uVar45 >> 3) & 1);
        auVar50._12_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ac0._12_4_;
        bVar47 = (bool)((byte)(uVar45 >> 4) & 1);
        auVar50._16_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ac0._16_4_;
        bVar47 = (bool)((byte)(uVar45 >> 5) & 1);
        auVar50._20_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ac0._20_4_;
        bVar47 = (bool)((byte)(uVar45 >> 6) & 1);
        auVar50._24_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ac0._24_4_;
        bVar47 = SUB81(uVar45 >> 7,0);
        auVar50._28_4_ = (uint)bVar47 * 0x219392ef | (uint)!bVar47 * local_5ac0._28_4_;
        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar84 = ZEXT3264(auVar51);
        auVar52 = vrcp14ps_avx512vl(auVar53);
        auVar53 = vfnmadd213ps_avx512vl(auVar53,auVar52,auVar51);
        auVar21 = vfmadd132ps_fma(auVar53,auVar52,auVar52);
        auVar53 = vrcp14ps_avx512vl(auVar54);
        auVar54 = vfnmadd213ps_avx512vl(auVar54,auVar53,auVar51);
        auVar22 = vfmadd132ps_fma(auVar54,auVar53,auVar53);
        auVar53 = vrcp14ps_avx512vl(auVar50);
        auVar50 = vfnmadd213ps_avx512vl(auVar50,auVar53,auVar51);
        local_5aa0 = ZEXT1632(auVar21);
        local_5a80 = ZEXT1632(auVar22);
        auVar23 = vfmadd132ps_fma(auVar50,auVar53,auVar53);
        local_5a60 = ZEXT1632(auVar23);
        local_5a00._4_4_ = *(float *)(ray + 0x44) * auVar23._4_4_;
        local_5a00._0_4_ = *(float *)(ray + 0x40) * auVar23._0_4_;
        local_5a00._8_4_ = *(float *)(ray + 0x48) * auVar23._8_4_;
        local_5a00._12_4_ = *(float *)(ray + 0x4c) * auVar23._12_4_;
        local_5a00._16_4_ = *(float *)(ray + 0x50) * 0.0;
        local_5a00._20_4_ = *(float *)(ray + 0x54) * 0.0;
        local_5a00._24_4_ = *(float *)(ray + 0x58) * 0.0;
        local_5a00._28_4_ = *(undefined4 *)(ray + 0x5c);
        local_5a40 = *(float *)ray * auVar21._0_4_;
        fStack_5a3c = *(float *)(ray + 4) * auVar21._4_4_;
        fStack_5a38 = *(float *)(ray + 8) * auVar21._8_4_;
        fStack_5a34 = *(float *)(ray + 0xc) * auVar21._12_4_;
        fStack_5a30 = *(float *)(ray + 0x10) * 0.0;
        fStack_5a2c = *(float *)(ray + 0x14) * 0.0;
        fStack_5a28 = *(float *)(ray + 0x18) * 0.0;
        uStack_5a24 = *(undefined4 *)(ray + 0x1c);
        local_5a20 = *(float *)(ray + 0x20) * auVar22._0_4_;
        fStack_5a1c = *(float *)(ray + 0x24) * auVar22._4_4_;
        fStack_5a18 = *(float *)(ray + 0x28) * auVar22._8_4_;
        fStack_5a14 = *(float *)(ray + 0x2c) * auVar22._12_4_;
        fStack_5a10 = *(float *)(ray + 0x30) * 0.0;
        fStack_5a0c = *(float *)(ray + 0x34) * 0.0;
        fStack_5a08 = *(float *)(ray + 0x38) * 0.0;
        uStack_5a04 = *(undefined4 *)(ray + 0x3c);
        uVar45 = vcmpps_avx512vl(ZEXT1632(auVar21),ZEXT1632(auVar49),1);
        auVar50 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_59e0 = (uint)((byte)uVar45 & 1) * auVar50._0_4_;
        iStack_59dc = (uint)((byte)(uVar45 >> 1) & 1) * auVar50._4_4_;
        iStack_59d8 = (uint)((byte)(uVar45 >> 2) & 1) * auVar50._8_4_;
        iStack_59d4 = (uint)((byte)(uVar45 >> 3) & 1) * auVar50._12_4_;
        iStack_59d0 = (uint)((byte)(uVar45 >> 4) & 1) * auVar50._16_4_;
        iStack_59cc = (uint)((byte)(uVar45 >> 5) & 1) * auVar50._20_4_;
        iStack_59c8 = (uint)((byte)(uVar45 >> 6) & 1) * auVar50._24_4_;
        iStack_59c4 = (uint)(byte)(uVar45 >> 7) * auVar50._28_4_;
        auVar53 = ZEXT1632(auVar49);
        uVar45 = vcmpps_avx512vl(ZEXT1632(auVar22),auVar53,5);
        auVar50 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar47 = (bool)((byte)uVar45 & 1);
        bVar8 = (bool)((byte)(uVar45 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar45 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar45 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar45 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar45 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar45 >> 6) & 1);
        bVar14 = SUB81(uVar45 >> 7,0);
        local_59c0 = (uint)bVar47 * auVar50._0_4_ | (uint)!bVar47 * 0x60;
        uStack_59bc = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * 0x60;
        uStack_59b8 = (uint)bVar9 * auVar50._8_4_ | (uint)!bVar9 * 0x60;
        uStack_59b4 = (uint)bVar10 * auVar50._12_4_ | (uint)!bVar10 * 0x60;
        uStack_59b0 = (uint)bVar11 * auVar50._16_4_ | (uint)!bVar11 * 0x60;
        uStack_59ac = (uint)bVar12 * auVar50._20_4_ | (uint)!bVar12 * 0x60;
        uStack_59a8 = (uint)bVar13 * auVar50._24_4_ | (uint)!bVar13 * 0x60;
        uStack_59a4 = (uint)bVar14 * auVar50._28_4_ | (uint)!bVar14 * 0x60;
        uVar45 = vcmpps_avx512vl(ZEXT1632(auVar23),auVar53,5);
        auVar50 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar47 = (bool)((byte)uVar45 & 1);
        bVar8 = (bool)((byte)(uVar45 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar45 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar45 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar45 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar45 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar45 >> 6) & 1);
        bVar14 = SUB81(uVar45 >> 7,0);
        local_59a0 = (uint)bVar47 * auVar50._0_4_ | (uint)!bVar47 * 0xa0;
        uStack_599c = (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * 0xa0;
        uStack_5998 = (uint)bVar9 * auVar50._8_4_ | (uint)!bVar9 * 0xa0;
        uStack_5994 = (uint)bVar10 * auVar50._12_4_ | (uint)!bVar10 * 0xa0;
        uStack_5990 = (uint)bVar11 * auVar50._16_4_ | (uint)!bVar11 * 0xa0;
        uStack_598c = (uint)bVar12 * auVar50._20_4_ | (uint)!bVar12 * 0xa0;
        uStack_5988 = (uint)bVar13 * auVar50._24_4_ | (uint)!bVar13 * 0xa0;
        uStack_5984 = (uint)bVar14 * auVar50._28_4_ | (uint)!bVar14 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar86 = ZEXT3264(local_4680);
        auVar50 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar53);
        local_5980 = (uint)(bVar37 & 1) * auVar50._0_4_ |
                     (uint)!(bool)(bVar37 & 1) * local_4680._0_4_;
        bVar47 = (bool)((byte)(uVar48 >> 1) & 1);
        uStack_597c = (uint)bVar47 * auVar50._4_4_ | (uint)!bVar47 * local_4680._4_4_;
        bVar47 = (bool)((byte)(uVar48 >> 2) & 1);
        uStack_5978 = (uint)bVar47 * auVar50._8_4_ | (uint)!bVar47 * local_4680._8_4_;
        bVar47 = (bool)((byte)(uVar48 >> 3) & 1);
        uStack_5974 = (uint)bVar47 * auVar50._12_4_ | (uint)!bVar47 * local_4680._12_4_;
        bVar47 = (bool)((byte)(uVar48 >> 4) & 1);
        uStack_5970 = (uint)bVar47 * auVar50._16_4_ | (uint)!bVar47 * local_4680._16_4_;
        bVar47 = (bool)((byte)(uVar48 >> 5) & 1);
        uStack_596c = (uint)bVar47 * auVar50._20_4_ | (uint)!bVar47 * local_4680._20_4_;
        bVar47 = (bool)((byte)(uVar48 >> 6) & 1);
        uStack_5968 = (uint)bVar47 * auVar50._24_4_ | (uint)!bVar47 * local_4680._24_4_;
        bVar47 = SUB81(uVar48 >> 7,0);
        uStack_5964 = (uint)bVar47 * auVar50._28_4_ | (uint)!bVar47 * local_4680._28_4_;
        auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar85 = ZEXT3264(auVar50);
        auVar53 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar53);
        local_5960._0_4_ =
             (uint)(bVar37 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar37 & 1) * auVar50._0_4_;
        bVar47 = (bool)((byte)(uVar48 >> 1) & 1);
        local_5960._4_4_ = (uint)bVar47 * auVar53._4_4_ | (uint)!bVar47 * auVar50._4_4_;
        bVar47 = (bool)((byte)(uVar48 >> 2) & 1);
        local_5960._8_4_ = (uint)bVar47 * auVar53._8_4_ | (uint)!bVar47 * auVar50._8_4_;
        bVar47 = (bool)((byte)(uVar48 >> 3) & 1);
        local_5960._12_4_ = (uint)bVar47 * auVar53._12_4_ | (uint)!bVar47 * auVar50._12_4_;
        bVar47 = (bool)((byte)(uVar48 >> 4) & 1);
        local_5960._16_4_ = (uint)bVar47 * auVar53._16_4_ | (uint)!bVar47 * auVar50._16_4_;
        bVar47 = (bool)((byte)(uVar48 >> 5) & 1);
        local_5960._20_4_ = (uint)bVar47 * auVar53._20_4_ | (uint)!bVar47 * auVar50._20_4_;
        bVar47 = (bool)((byte)(uVar48 >> 6) & 1);
        local_5960._24_4_ = (uint)bVar47 * auVar53._24_4_ | (uint)!bVar47 * auVar50._24_4_;
        bVar47 = SUB81(uVar48 >> 7,0);
        local_5960._28_4_ = (uint)bVar47 * auVar53._28_4_ | (uint)!bVar47 * auVar50._28_4_;
        bVar37 = ~bVar37;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar45 = 7;
        }
        else {
          uVar45 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5d18 = ray + 0x100;
        puVar46 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar40 = (undefined1 (*) [32])local_4640;
        local_5808 = (local_5d30->root).ptr;
        local_4660 = local_5980;
        uStack_465c = uStack_597c;
        uStack_4658 = uStack_5978;
        uStack_4654 = uStack_5974;
        uStack_4650 = uStack_5970;
        uStack_464c = uStack_596c;
        uStack_4648 = uStack_5968;
        uStack_4644 = uStack_5964;
        auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar87 = ZEXT3264(auVar50);
        auVar49 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
        auVar88 = ZEXT1664(auVar49);
        local_5d28 = This;
        local_5d20 = context;
        local_5d10 = uVar45;
LAB_00872a8f:
        pauVar40 = pauVar40 + -1;
        root.ptr = puVar46[-1];
        puVar46 = puVar46 + -1;
        if (root.ptr == 0xfffffffffffffff8) goto LAB_008732d7;
        auVar50 = *pauVar40;
        uVar44 = vcmpps_avx512vl(auVar50,local_5960,1);
        if ((char)uVar44 == '\0') {
LAB_008732e8:
          iVar38 = 2;
        }
        else {
          uVar43 = (undefined4)uVar44;
          iVar38 = 0;
          pRVar35 = ray;
          if ((uint)POPCOUNT(uVar43) <= uVar45) {
            do {
              local_5cc0 = auVar50;
              local_5d38 = pRVar35;
              local_5d40 = 0;
              for (uVar45 = uVar44; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
                local_5d40 = local_5d40 + 1;
              }
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              bVar47 = occluded1(local_5d28,local_5d30,root,local_5d40,&local_5d41,local_5d38,
                                 (TravRayK<8,_false> *)&local_5b60.field_0,local_5d20);
              bVar42 = (byte)(1 << ((uint)local_5d40 & 0x1f));
              if (!bVar47) {
                bVar42 = 0;
              }
              bVar37 = bVar37 | bVar42;
              uVar44 = uVar44 - 1 & uVar44;
              pRVar35 = local_5d38;
              auVar50 = local_5cc0;
            } while (uVar44 != 0);
            if (bVar37 == 0xff) {
              iVar38 = 3;
            }
            else {
              auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              bVar47 = (bool)(bVar37 >> 1 & 1);
              bVar8 = (bool)(bVar37 >> 2 & 1);
              bVar9 = (bool)(bVar37 >> 3 & 1);
              bVar10 = (bool)(bVar37 >> 4 & 1);
              bVar11 = (bool)(bVar37 >> 5 & 1);
              bVar12 = (bool)(bVar37 >> 6 & 1);
              local_5960._4_4_ = (uint)bVar47 * auVar53._4_4_ | (uint)!bVar47 * local_5960._4_4_;
              local_5960._0_4_ =
                   (uint)(bVar37 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar37 & 1) * local_5960._0_4_
              ;
              local_5960._8_4_ = (uint)bVar8 * auVar53._8_4_ | (uint)!bVar8 * local_5960._8_4_;
              local_5960._12_4_ = (uint)bVar9 * auVar53._12_4_ | (uint)!bVar9 * local_5960._12_4_;
              local_5960._16_4_ = (uint)bVar10 * auVar53._16_4_ | (uint)!bVar10 * local_5960._16_4_;
              local_5960._20_4_ = (uint)bVar11 * auVar53._20_4_ | (uint)!bVar11 * local_5960._20_4_;
              local_5960._24_4_ = (uint)bVar12 * auVar53._24_4_ | (uint)!bVar12 * local_5960._24_4_;
              local_5960._28_4_ =
                   (uint)(bVar37 >> 7) * auVar53._28_4_ |
                   (uint)!(bool)(bVar37 >> 7) * local_5960._28_4_;
              iVar38 = 2;
            }
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar83 = ZEXT3264(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar84 = ZEXT3264(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar85 = ZEXT3264(auVar53);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar86 = ZEXT3264(auVar53);
            uVar48 = uVar48 & 0xffffffff;
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar87 = ZEXT3264(auVar53);
            auVar49 = vxorps_avx512vl(auVar88._0_16_,auVar88._0_16_);
            auVar88 = ZEXT1664(auVar49);
            ray = local_5d38;
          }
          auVar72 = ZEXT3264(auVar50);
          uVar45 = local_5d10;
          if ((uint)local_5d10 < (uint)POPCOUNT(uVar43)) {
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_008732d7;
                uVar18 = vcmpps_avx512vl(auVar72._0_32_,local_5960,9);
                if ((char)uVar18 == '\0') goto LAB_008732e8;
                local_5d08 = (ulong)((uint)root.ptr & 0xf) - 8;
                bVar42 = bVar37;
                if (local_5d08 == 0) goto LAB_008732a9;
                local_5d59 = ~bVar37;
                lVar41 = (root.ptr & 0xfffffffffffffff0) + 0x40;
                uVar45 = 0;
                goto LAB_00872ca6;
              }
              auVar72 = ZEXT3264(auVar86._0_32_);
              uVar44 = 0;
              uVar39 = 8;
              do {
                uVar4 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar44 * 8);
                if (uVar4 != 8) {
                  auVar32._4_4_ = fStack_5a3c;
                  auVar32._0_4_ = local_5a40;
                  auVar32._8_4_ = fStack_5a38;
                  auVar32._12_4_ = fStack_5a34;
                  auVar32._16_4_ = fStack_5a30;
                  auVar32._20_4_ = fStack_5a2c;
                  auVar32._24_4_ = fStack_5a28;
                  auVar32._28_4_ = uStack_5a24;
                  uVar43 = *(undefined4 *)(root.ptr + 0x40 + uVar44 * 4);
                  auVar63._4_4_ = uVar43;
                  auVar63._0_4_ = uVar43;
                  auVar63._8_4_ = uVar43;
                  auVar63._12_4_ = uVar43;
                  auVar63._16_4_ = uVar43;
                  auVar63._20_4_ = uVar43;
                  auVar63._24_4_ = uVar43;
                  auVar63._28_4_ = uVar43;
                  auVar49 = vfmsub132ps_fma(auVar63,auVar32,local_5aa0);
                  auVar33._4_4_ = fStack_5a1c;
                  auVar33._0_4_ = local_5a20;
                  auVar33._8_4_ = fStack_5a18;
                  auVar33._12_4_ = fStack_5a14;
                  auVar33._16_4_ = fStack_5a10;
                  auVar33._20_4_ = fStack_5a0c;
                  auVar33._24_4_ = fStack_5a08;
                  auVar33._28_4_ = uStack_5a04;
                  uVar43 = *(undefined4 *)(root.ptr + 0x80 + uVar44 * 4);
                  auVar67._4_4_ = uVar43;
                  auVar67._0_4_ = uVar43;
                  auVar67._8_4_ = uVar43;
                  auVar67._12_4_ = uVar43;
                  auVar67._16_4_ = uVar43;
                  auVar67._20_4_ = uVar43;
                  auVar67._24_4_ = uVar43;
                  auVar67._28_4_ = uVar43;
                  uVar43 = *(undefined4 *)(root.ptr + 0xc0 + uVar44 * 4);
                  auVar70._4_4_ = uVar43;
                  auVar70._0_4_ = uVar43;
                  auVar70._8_4_ = uVar43;
                  auVar70._12_4_ = uVar43;
                  auVar70._16_4_ = uVar43;
                  auVar70._20_4_ = uVar43;
                  auVar70._24_4_ = uVar43;
                  auVar70._28_4_ = uVar43;
                  auVar21 = vfmsub132ps_fma(auVar67,auVar33,local_5a80);
                  auVar22 = vfmsub132ps_fma(auVar70,local_5a00,local_5a60);
                  uVar43 = *(undefined4 *)(root.ptr + 0x60 + uVar44 * 4);
                  auVar26._4_4_ = uVar43;
                  auVar26._0_4_ = uVar43;
                  auVar26._8_4_ = uVar43;
                  auVar26._12_4_ = uVar43;
                  auVar26._16_4_ = uVar43;
                  auVar26._20_4_ = uVar43;
                  auVar26._24_4_ = uVar43;
                  auVar26._28_4_ = uVar43;
                  auVar54 = vfmsub132ps_avx512vl(local_5aa0,auVar32,auVar26);
                  uVar43 = *(undefined4 *)(root.ptr + 0xa0 + uVar44 * 4);
                  auVar27._4_4_ = uVar43;
                  auVar27._0_4_ = uVar43;
                  auVar27._8_4_ = uVar43;
                  auVar27._12_4_ = uVar43;
                  auVar27._16_4_ = uVar43;
                  auVar27._20_4_ = uVar43;
                  auVar27._24_4_ = uVar43;
                  auVar27._28_4_ = uVar43;
                  auVar51 = vfmsub132ps_avx512vl(local_5a80,auVar33,auVar27);
                  uVar43 = *(undefined4 *)(root.ptr + 0xe0 + uVar44 * 4);
                  auVar28._4_4_ = uVar43;
                  auVar28._0_4_ = uVar43;
                  auVar28._8_4_ = uVar43;
                  auVar28._12_4_ = uVar43;
                  auVar28._16_4_ = uVar43;
                  auVar28._20_4_ = uVar43;
                  auVar28._24_4_ = uVar43;
                  auVar28._28_4_ = uVar43;
                  auVar52 = vfmsub132ps_avx512vl(local_5a60,local_5a00,auVar28);
                  auVar50 = vpminsd_avx2(ZEXT1632(auVar49),auVar54);
                  auVar53 = vpminsd_avx2(ZEXT1632(auVar21),auVar51);
                  auVar50 = vpmaxsd_avx2(auVar50,auVar53);
                  auVar53 = vpminsd_avx2(ZEXT1632(auVar22),auVar52);
                  auVar50 = vpmaxsd_avx2(auVar50,auVar53);
                  auVar53 = vpmaxsd_avx2(ZEXT1632(auVar49),auVar54);
                  auVar54 = vpmaxsd_avx2(ZEXT1632(auVar21),auVar51);
                  auVar54 = vpminsd_avx2(auVar53,auVar54);
                  auVar53 = vpmaxsd_avx2(ZEXT1632(auVar22),auVar52);
                  auVar54 = vpminsd_avx2(auVar54,auVar53);
                  auVar34._4_4_ = uStack_597c;
                  auVar34._0_4_ = local_5980;
                  auVar34._8_4_ = uStack_5978;
                  auVar34._12_4_ = uStack_5974;
                  auVar34._16_4_ = uStack_5970;
                  auVar34._20_4_ = uStack_596c;
                  auVar34._24_4_ = uStack_5968;
                  auVar34._28_4_ = uStack_5964;
                  auVar53 = vpmaxsd_avx2(auVar50,auVar34);
                  auVar54 = vpminsd_avx2(auVar54,local_5960);
                  uVar20 = vpcmpd_avx512vl(auVar53,auVar54,2);
                  if ((byte)uVar20 != 0) {
                    auVar53 = vblendmps_avx512vl(auVar86._0_32_,auVar50);
                    bVar47 = (bool)((byte)uVar20 & 1);
                    bVar8 = (bool)((byte)(uVar20 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar20 >> 2) & 1);
                    bVar10 = (bool)((byte)(uVar20 >> 3) & 1);
                    bVar11 = (bool)((byte)(uVar20 >> 4) & 1);
                    bVar12 = (bool)((byte)(uVar20 >> 5) & 1);
                    bVar13 = (bool)((byte)(uVar20 >> 6) & 1);
                    bVar14 = SUB81(uVar20 >> 7,0);
                    if (uVar39 != 8) {
                      *puVar46 = uVar39;
                      puVar46 = puVar46 + 1;
                      *pauVar40 = auVar72._0_32_;
                      pauVar40 = pauVar40 + 1;
                    }
                    auVar72 = ZEXT3264(CONCAT428((uint)bVar14 * auVar53._28_4_ |
                                                 (uint)!bVar14 * auVar50._28_4_,
                                                 CONCAT424((uint)bVar13 * auVar53._24_4_ |
                                                           (uint)!bVar13 * auVar50._24_4_,
                                                           CONCAT420((uint)bVar12 * auVar53._20_4_ |
                                                                     (uint)!bVar12 * auVar50._20_4_,
                                                                     CONCAT416((uint)bVar11 *
                                                                               auVar53._16_4_ |
                                                                               (uint)!bVar11 *
                                                                               auVar50._16_4_,
                                                                               CONCAT412((uint)
                                                  bVar10 * auVar53._12_4_ |
                                                  (uint)!bVar10 * auVar50._12_4_,
                                                  CONCAT48((uint)bVar9 * auVar53._8_4_ |
                                                           (uint)!bVar9 * auVar50._8_4_,
                                                           CONCAT44((uint)bVar8 * auVar53._4_4_ |
                                                                    (uint)!bVar8 * auVar50._4_4_,
                                                                    (uint)bVar47 * auVar53._0_4_ |
                                                                    (uint)!bVar47 * auVar50._0_4_)))
                                                  )))));
                    uVar39 = uVar4;
                  }
                }
              } while ((uVar4 != 8) && (bVar47 = uVar44 < 7, uVar44 = uVar44 + 1, bVar47));
              iVar38 = 0;
              if (uVar39 == 8) {
LAB_00872c59:
                bVar47 = false;
                iVar38 = 4;
              }
              else {
                uVar18 = vcmpps_avx512vl(auVar72._0_32_,local_5960,9);
                bVar47 = true;
                if ((uint)POPCOUNT((int)uVar18) <= (uint)local_5d10) {
                  *puVar46 = uVar39;
                  puVar46 = puVar46 + 1;
                  *pauVar40 = auVar72._0_32_;
                  pauVar40 = pauVar40 + 1;
                  goto LAB_00872c59;
                }
              }
              root.ptr = uVar39;
            } while (bVar47);
          }
        }
        goto LAB_008732da;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar45 = local_5d00 + 1;
    lVar41 = lVar41 + 0x50;
    if (local_5d08 <= uVar45) break;
LAB_00872ca6:
    local_5cc0._0_8_ = uVar45 * 0x50 + (root.ptr & 0xfffffffffffffff0);
    local_5cf8 = local_5d20->scene;
    uVar44 = 0;
    bVar42 = local_5d59;
    local_5d00 = uVar45;
    while (*(int *)(lVar41 + uVar44 * 4) != -1) {
      pfVar5 = (local_5cf8->vertices).items[*(uint *)(lVar41 + -0x10 + uVar44 * 4)];
      uVar45 = (ulong)*(uint *)(lVar41 + -0x40 + uVar44 * 4);
      fVar1 = pfVar5[uVar45];
      auVar61._4_4_ = fVar1;
      auVar61._0_4_ = fVar1;
      auVar61._8_4_ = fVar1;
      auVar61._12_4_ = fVar1;
      auVar61._16_4_ = fVar1;
      auVar61._20_4_ = fVar1;
      auVar61._24_4_ = fVar1;
      auVar61._28_4_ = fVar1;
      uVar39 = (ulong)*(uint *)(lVar41 + -0x30 + uVar44 * 4);
      fVar2 = pfVar5[uVar45 + 1];
      auVar64._4_4_ = fVar2;
      auVar64._0_4_ = fVar2;
      auVar64._8_4_ = fVar2;
      auVar64._12_4_ = fVar2;
      auVar64._16_4_ = fVar2;
      auVar64._20_4_ = fVar2;
      auVar64._24_4_ = fVar2;
      auVar64._28_4_ = fVar2;
      fVar3 = pfVar5[uVar45 + 2];
      auVar69._4_4_ = fVar3;
      auVar69._0_4_ = fVar3;
      auVar69._8_4_ = fVar3;
      auVar69._12_4_ = fVar3;
      auVar69._16_4_ = fVar3;
      auVar69._20_4_ = fVar3;
      auVar69._24_4_ = fVar3;
      auVar69._28_4_ = fVar3;
      uVar45 = (ulong)*(uint *)(lVar41 + -0x20 + uVar44 * 4);
      fVar15 = fVar1 - pfVar5[uVar39];
      fVar16 = fVar2 - pfVar5[uVar39 + 1];
      fVar17 = fVar3 - pfVar5[uVar39 + 2];
      local_5c70 = *(undefined8 *)(local_5cc0._0_8_ + 0x30);
      uStack_5c68 = *(undefined8 *)(local_5cc0._0_8_ + 0x38);
      local_5c80 = *(undefined8 *)(local_5cc0._0_8_ + 0x40);
      uStack_5c78 = *(undefined8 *)(local_5cc0._0_8_ + 0x48);
      auVar65._4_4_ = fVar15;
      auVar65._0_4_ = fVar15;
      auVar65._8_4_ = fVar15;
      auVar65._12_4_ = fVar15;
      auVar65._16_4_ = fVar15;
      auVar65._20_4_ = fVar15;
      auVar65._24_4_ = fVar15;
      auVar65._28_4_ = fVar15;
      auVar71._4_4_ = fVar16;
      auVar71._0_4_ = fVar16;
      auVar71._8_4_ = fVar16;
      auVar71._12_4_ = fVar16;
      auVar71._16_4_ = fVar16;
      auVar71._20_4_ = fVar16;
      auVar71._24_4_ = fVar16;
      auVar71._28_4_ = fVar16;
      auVar57._4_4_ = fVar17;
      auVar57._0_4_ = fVar17;
      auVar57._8_4_ = fVar17;
      auVar57._12_4_ = fVar17;
      auVar57._16_4_ = fVar17;
      auVar57._20_4_ = fVar17;
      auVar57._24_4_ = fVar17;
      auVar57._28_4_ = fVar17;
      fVar1 = pfVar5[uVar45] - fVar1;
      auVar82._4_4_ = fVar1;
      auVar82._0_4_ = fVar1;
      auVar82._8_4_ = fVar1;
      auVar82._12_4_ = fVar1;
      auVar82._16_4_ = fVar1;
      auVar82._20_4_ = fVar1;
      auVar82._24_4_ = fVar1;
      auVar82._28_4_ = fVar1;
      auVar55 = vbroadcastss_avx512vl(ZEXT416((uint)(pfVar5[uVar45 + 1] - fVar2)));
      auVar56 = vbroadcastss_avx512vl(ZEXT416((uint)(pfVar5[uVar45 + 2] - fVar3)));
      fVar16 = fVar16 * (pfVar5[uVar45 + 2] - fVar3);
      auVar52._4_4_ = fVar16;
      auVar52._0_4_ = fVar16;
      auVar52._8_4_ = fVar16;
      auVar52._12_4_ = fVar16;
      auVar52._16_4_ = fVar16;
      auVar52._20_4_ = fVar16;
      auVar52._24_4_ = fVar16;
      auVar52._28_4_ = fVar16;
      auVar57 = vfmsub231ps_avx512vl(auVar52,auVar55,auVar57);
      fVar1 = fVar17 * fVar1;
      auVar59._4_4_ = fVar1;
      auVar59._0_4_ = fVar1;
      auVar59._8_4_ = fVar1;
      auVar59._12_4_ = fVar1;
      auVar59._16_4_ = fVar1;
      auVar59._20_4_ = fVar1;
      auVar59._24_4_ = fVar1;
      auVar59._28_4_ = fVar1;
      auVar58 = vfmsub231ps_avx512vl(auVar59,auVar56,auVar65);
      fVar15 = (pfVar5[uVar45 + 1] - fVar2) * fVar15;
      auVar60._4_4_ = fVar15;
      auVar60._0_4_ = fVar15;
      auVar60._8_4_ = fVar15;
      auVar60._12_4_ = fVar15;
      auVar60._16_4_ = fVar15;
      auVar60._20_4_ = fVar15;
      auVar60._24_4_ = fVar15;
      auVar60._28_4_ = fVar15;
      auVar22 = vfmsub231ps_fma(auVar60,auVar82,auVar71);
      auVar51 = vsubps_avx(auVar61,*(undefined1 (*) [32])ray);
      auVar52 = vsubps_avx(auVar64,*(undefined1 (*) [32])(ray + 0x20));
      auVar59 = vsubps_avx(auVar69,*(undefined1 (*) [32])(ray + 0x40));
      auVar50 = *(undefined1 (*) [32])(ray + 0x80);
      auVar53 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar54 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar80._0_4_ = auVar53._0_4_ * auVar59._0_4_;
      auVar80._4_4_ = auVar53._4_4_ * auVar59._4_4_;
      auVar80._8_4_ = auVar53._8_4_ * auVar59._8_4_;
      auVar80._12_4_ = auVar53._12_4_ * auVar59._12_4_;
      auVar80._16_4_ = auVar53._16_4_ * auVar59._16_4_;
      auVar80._20_4_ = auVar53._20_4_ * auVar59._20_4_;
      auVar80._24_4_ = auVar53._24_4_ * auVar59._24_4_;
      auVar80._28_4_ = 0;
      auVar23 = vfmsub231ps_fma(auVar80,auVar52,auVar54);
      auVar81._0_4_ = auVar54._0_4_ * auVar51._0_4_;
      auVar81._4_4_ = auVar54._4_4_ * auVar51._4_4_;
      auVar81._8_4_ = auVar54._8_4_ * auVar51._8_4_;
      auVar81._12_4_ = auVar54._12_4_ * auVar51._12_4_;
      auVar81._16_4_ = auVar54._16_4_ * auVar51._16_4_;
      auVar81._20_4_ = auVar54._20_4_ * auVar51._20_4_;
      auVar81._24_4_ = auVar54._24_4_ * auVar51._24_4_;
      auVar81._28_4_ = 0;
      auVar24 = vfmsub231ps_fma(auVar81,auVar59,auVar50);
      auVar72._0_4_ = auVar50._0_4_ * auVar52._0_4_;
      auVar72._4_4_ = auVar50._4_4_ * auVar52._4_4_;
      auVar72._8_4_ = auVar50._8_4_ * auVar52._8_4_;
      auVar72._12_4_ = auVar50._12_4_ * auVar52._12_4_;
      auVar72._16_4_ = auVar50._16_4_ * auVar52._16_4_;
      auVar72._20_4_ = auVar50._20_4_ * auVar52._20_4_;
      auVar72._28_36_ = in_ZMM14._28_36_;
      auVar72._24_4_ = auVar50._24_4_ * auVar52._24_4_;
      auVar25 = vfmsub231ps_fma(auVar72._0_32_,auVar51,auVar53);
      in_ZMM14 = ZEXT1664(auVar25);
      auVar29._4_4_ = auVar22._4_4_ * auVar54._4_4_;
      auVar29._0_4_ = auVar22._0_4_ * auVar54._0_4_;
      auVar29._8_4_ = auVar22._8_4_ * auVar54._8_4_;
      auVar29._12_4_ = auVar22._12_4_ * auVar54._12_4_;
      auVar29._16_4_ = auVar54._16_4_ * 0.0;
      auVar29._20_4_ = auVar54._20_4_ * 0.0;
      auVar29._24_4_ = auVar54._24_4_ * 0.0;
      auVar29._28_4_ = auVar54._28_4_;
      auVar49 = vfmadd231ps_fma(auVar29,auVar58,auVar53);
      auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar57,auVar50);
      vandps_avx512vl(ZEXT1632(auVar49),auVar87._0_32_);
      auVar50 = vmulps_avx512vl(auVar56,ZEXT1632(auVar25));
      auVar50 = vfmadd231ps_avx512vl(auVar50,ZEXT1632(auVar24),auVar55);
      auVar21 = vfmadd231ps_fma(auVar50,ZEXT1632(auVar23),auVar82);
      uVar73 = auVar58._0_4_;
      auVar55._0_4_ = uVar73 ^ auVar21._0_4_;
      uVar74 = auVar58._4_4_;
      auVar55._4_4_ = uVar74 ^ auVar21._4_4_;
      uVar75 = auVar58._8_4_;
      auVar55._8_4_ = uVar75 ^ auVar21._8_4_;
      uVar76 = auVar58._12_4_;
      auVar55._12_4_ = uVar76 ^ auVar21._12_4_;
      uVar43 = auVar58._16_4_;
      auVar55._16_4_ = uVar43;
      uVar77 = auVar58._20_4_;
      auVar55._20_4_ = uVar77;
      uVar78 = auVar58._24_4_;
      auVar55._24_4_ = uVar78;
      uVar79 = auVar58._28_4_;
      auVar55._28_4_ = uVar79;
      uVar18 = vcmpps_avx512vl(auVar55,auVar88._0_32_,5);
      bVar36 = (byte)uVar18 & bVar42;
      local_5d40 = CONCAT71(local_5d40._1_7_,bVar42);
      if (bVar36 == 0) {
LAB_00872e35:
        bVar36 = 0;
      }
      else {
        auVar56._4_4_ = fVar17 * auVar25._4_4_;
        auVar56._0_4_ = fVar17 * auVar25._0_4_;
        auVar56._8_4_ = fVar17 * auVar25._8_4_;
        auVar56._12_4_ = fVar17 * auVar25._12_4_;
        auVar56._16_4_ = fVar17 * 0.0;
        auVar56._20_4_ = fVar17 * 0.0;
        auVar56._24_4_ = fVar17 * 0.0;
        auVar56._28_4_ = fVar17;
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar24),auVar71,auVar56);
        auVar21 = vfmadd213ps_fma(ZEXT1632(auVar23),auVar65,ZEXT1632(auVar21));
        auVar66._0_4_ = uVar73 ^ auVar21._0_4_;
        auVar66._4_4_ = uVar74 ^ auVar21._4_4_;
        auVar66._8_4_ = uVar75 ^ auVar21._8_4_;
        auVar66._12_4_ = uVar76 ^ auVar21._12_4_;
        auVar66._16_4_ = uVar43;
        auVar66._20_4_ = uVar77;
        auVar66._24_4_ = uVar78;
        auVar66._28_4_ = uVar79;
        uVar18 = vcmpps_avx512vl(auVar66,auVar88._0_32_,5);
        bVar36 = bVar36 & (byte)uVar18;
        if (bVar36 == 0) goto LAB_00872e35;
        auVar53 = auVar83._0_32_;
        vandps_avx512vl(ZEXT1632(auVar49),auVar53);
        auVar50 = vsubps_avx(auVar53,auVar55);
        uVar18 = vcmpps_avx512vl(auVar50,auVar66,5);
        bVar36 = bVar36 & (byte)uVar18;
        if (bVar36 == 0) {
LAB_008731a5:
          bVar36 = 0;
        }
        else {
          auVar30._4_4_ = auVar59._4_4_ * auVar22._4_4_;
          auVar30._0_4_ = auVar59._0_4_ * auVar22._0_4_;
          auVar30._8_4_ = auVar59._8_4_ * auVar22._8_4_;
          auVar30._12_4_ = auVar59._12_4_ * auVar22._12_4_;
          auVar30._16_4_ = auVar59._16_4_ * 0.0;
          auVar30._20_4_ = auVar59._20_4_ * 0.0;
          auVar30._24_4_ = auVar59._24_4_ * 0.0;
          auVar30._28_4_ = auVar59._28_4_;
          auVar21 = vfmadd213ps_fma(auVar52,auVar58,auVar30);
          auVar21 = vfmadd213ps_fma(auVar51,auVar57,ZEXT1632(auVar21));
          auVar68._0_4_ = auVar83._0_4_ * *(float *)(ray + 0x60);
          auVar68._4_4_ = auVar83._4_4_ * *(float *)(ray + 100);
          auVar68._8_4_ = auVar83._8_4_ * *(float *)(ray + 0x68);
          auVar68._12_4_ = auVar83._12_4_ * *(float *)(ray + 0x6c);
          auVar68._16_4_ = auVar83._16_4_ * *(float *)(ray + 0x70);
          auVar68._20_4_ = auVar83._20_4_ * *(float *)(ray + 0x74);
          auVar68._24_4_ = auVar83._24_4_ * *(float *)(ray + 0x78);
          auVar68._28_4_ = 0;
          auVar62._0_4_ = uVar73 ^ auVar21._0_4_;
          auVar62._4_4_ = uVar74 ^ auVar21._4_4_;
          auVar62._8_4_ = uVar75 ^ auVar21._8_4_;
          auVar62._12_4_ = uVar76 ^ auVar21._12_4_;
          auVar62._16_4_ = uVar43;
          auVar62._20_4_ = uVar77;
          auVar62._24_4_ = uVar78;
          auVar62._28_4_ = uVar79;
          auVar31._4_4_ = auVar83._4_4_ * *(float *)(ray + 0x104);
          auVar31._0_4_ = auVar83._0_4_ * *(float *)(ray + 0x100);
          auVar31._8_4_ = auVar83._8_4_ * *(float *)(ray + 0x108);
          auVar31._12_4_ = auVar83._12_4_ * *(float *)(ray + 0x10c);
          auVar31._16_4_ = auVar83._16_4_ * *(float *)(ray + 0x110);
          auVar31._20_4_ = auVar83._20_4_ * *(float *)(ray + 0x114);
          auVar31._24_4_ = auVar83._24_4_ * *(float *)(ray + 0x118);
          auVar31._28_4_ = auVar59._28_4_;
          uVar18 = vcmpps_avx512vl(auVar62,auVar31,2);
          uVar19 = vcmpps_avx512vl(auVar68,auVar62,1);
          bVar36 = bVar36 & (byte)uVar18 & (byte)uVar19;
          if (bVar36 == 0) goto LAB_008731a5;
          uVar18 = vcmpps_avx512vl(ZEXT1632(auVar49),ZEXT832(0) << 0x20,4);
          bVar36 = bVar36 & (byte)uVar18;
          if (bVar36 != 0) {
            _local_5b80 = auVar55;
            _local_5ba0 = auVar66;
            local_5bc0 = auVar62;
            local_5be0 = auVar53;
            local_5c00 = auVar57;
            local_5c20 = auVar58;
            local_5c40 = ZEXT1632(auVar22);
          }
        }
        auVar83 = ZEXT3264(auVar53);
        auVar49 = vxorps_avx512vl(auVar88._0_16_,auVar88._0_16_);
        auVar88 = ZEXT1664(auVar49);
      }
      auVar49 = auVar88._0_16_;
      pGVar6 = (local_5d20->scene->geometries).items[*(uint *)((long)&local_5c70 + uVar44 * 4)].ptr;
      uVar73 = pGVar6->mask;
      auVar58._4_4_ = uVar73;
      auVar58._0_4_ = uVar73;
      auVar58._8_4_ = uVar73;
      auVar58._12_4_ = uVar73;
      auVar58._16_4_ = uVar73;
      auVar58._20_4_ = uVar73;
      auVar58._24_4_ = uVar73;
      auVar58._28_4_ = uVar73;
      uVar18 = vptestmd_avx512vl(auVar58,*(undefined1 (*) [32])(ray + 0x120));
      bVar36 = (byte)uVar18 & bVar36;
      if (bVar36 != 0) {
        if ((local_5d20->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar50 = vrcp14ps_avx512vl(local_5be0);
          auVar53 = vfnmadd213ps_avx512vl(auVar50,local_5be0,auVar84._0_32_);
          auVar21 = vfmadd132ps_fma(auVar53,auVar50,auVar50);
          local_58e0._4_4_ = auVar21._4_4_ * (float)local_5b80._4_4_;
          local_58e0._0_4_ = auVar21._0_4_ * (float)local_5b80._0_4_;
          local_58e0._8_4_ = auVar21._8_4_ * fStack_5b78;
          local_58e0._12_4_ = auVar21._12_4_ * fStack_5b74;
          local_58e0._16_4_ = fStack_5b70 * 0.0;
          local_58e0._20_4_ = fStack_5b6c * 0.0;
          local_58e0._24_4_ = fStack_5b68 * 0.0;
          local_58e0._28_4_ = auVar50._28_4_;
          local_5880 = vpbroadcastd_avx512vl();
          local_58a0 = vpbroadcastd_avx512vl();
          local_5940 = local_5c00._0_8_;
          uStack_5938 = local_5c00._8_8_;
          uStack_5930 = local_5c00._16_8_;
          uStack_5928 = local_5c00._24_8_;
          local_5920 = local_5c20._0_8_;
          uStack_5918 = local_5c20._8_8_;
          uStack_5910 = local_5c20._16_8_;
          uStack_5908 = local_5c20._24_8_;
          local_5900 = local_5c40;
          local_58c0 = auVar21._0_4_ * (float)local_5ba0._0_4_;
          fStack_58bc = auVar21._4_4_ * (float)local_5ba0._4_4_;
          fStack_58b8 = auVar21._8_4_ * fStack_5b98;
          fStack_58b4 = auVar21._12_4_ * fStack_5b94;
          fStack_58b0 = fStack_5b90 * 0.0;
          fStack_58ac = fStack_5b8c * 0.0;
          fStack_58a8 = fStack_5b88 * 0.0;
          uStack_58a4 = local_5be0._28_4_;
          vpcmpeqd_avx2(local_58e0,local_58e0);
          uStack_585c = local_5d20->user->instID[0];
          local_5860 = uStack_585c;
          uStack_5858 = uStack_585c;
          uStack_5854 = uStack_585c;
          uStack_5850 = uStack_585c;
          uStack_584c = uStack_585c;
          uStack_5848 = uStack_585c;
          uStack_5844 = uStack_585c;
          uStack_583c = local_5d20->user->instPrimID[0];
          local_5840 = uStack_583c;
          uStack_5838 = uStack_583c;
          uStack_5834 = uStack_583c;
          uStack_5830 = uStack_583c;
          uStack_582c = uStack_583c;
          uStack_5828 = uStack_583c;
          uStack_5824 = uStack_583c;
          local_5c60 = *(int *)(ray + 0x100);
          iStack_5c5c = *(int *)(ray + 0x104);
          iStack_5c58 = *(int *)(ray + 0x108);
          iStack_5c54 = *(int *)(ray + 0x10c);
          iStack_5c50 = *(int *)(ray + 0x110);
          iStack_5c4c = *(int *)(ray + 0x114);
          iStack_5c48 = *(int *)(ray + 0x118);
          iStack_5c44 = *(int *)(ray + 0x11c);
          auVar50 = vmulps_avx512vl(ZEXT1632(auVar21),local_5bc0);
          bVar47 = (bool)(bVar36 >> 1 & 1);
          bVar8 = (bool)(bVar36 >> 2 & 1);
          bVar9 = (bool)(bVar36 >> 3 & 1);
          bVar10 = (bool)(bVar36 >> 4 & 1);
          bVar11 = (bool)(bVar36 >> 5 & 1);
          bVar12 = (bool)(bVar36 >> 6 & 1);
          *(uint *)(ray + 0x100) =
               (uint)(bVar36 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar36 & 1) * local_5c60;
          *(uint *)(ray + 0x104) = (uint)bVar47 * auVar50._4_4_ | (uint)!bVar47 * iStack_5c5c;
          *(uint *)(ray + 0x108) = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * iStack_5c58;
          *(uint *)(ray + 0x10c) = (uint)bVar9 * auVar50._12_4_ | (uint)!bVar9 * iStack_5c54;
          *(uint *)(ray + 0x110) = (uint)bVar10 * auVar50._16_4_ | (uint)!bVar10 * iStack_5c50;
          *(uint *)(ray + 0x114) = (uint)bVar11 * auVar50._20_4_ | (uint)!bVar11 * iStack_5c4c;
          *(uint *)(ray + 0x118) = (uint)bVar12 * auVar50._24_4_ | (uint)!bVar12 * iStack_5c48;
          *(uint *)(ray + 0x11c) =
               (uint)(bVar36 >> 7) * auVar50._28_4_ | (uint)!(bool)(bVar36 >> 7) * iStack_5c44;
          local_5ca0 = vpmovm2d_avx512vl((ulong)bVar36);
          local_5cf0.valid = (int *)local_5ca0;
          local_5cf0.geometryUserPtr = pGVar6->userPtr;
          local_5cf0.context = local_5d20->user;
          local_5cf0.hit = (RTCHitN *)&local_5940;
          local_5cf0.N = 8;
          uVar45 = uVar48;
          local_5cf0.ray = (RTCRayN *)ray;
          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            in_ZMM14 = ZEXT1664(auVar25);
            local_5d38 = ray;
            (*pGVar6->occlusionFilterN)(&local_5cf0);
            auVar49 = vxorps_avx512vl(auVar49,auVar49);
            auVar88 = ZEXT1664(auVar49);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar87 = ZEXT3264(auVar50);
            uVar45 = uVar48 & 0xffffffff;
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar86 = ZEXT3264(auVar50);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar85 = ZEXT3264(auVar50);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar84 = ZEXT3264(auVar50);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar83 = ZEXT3264(auVar50);
            ray = local_5d38;
          }
          auVar49 = auVar88._0_16_;
          uVar39 = vptestmd_avx512vl(local_5ca0,local_5ca0);
          if ((char)uVar39 != '\0') {
            p_Var7 = local_5d20->args->filter;
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((local_5d20->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              (*p_Var7)(&local_5cf0);
              auVar49 = vxorps_avx512vl(auVar49,auVar49);
              auVar88 = ZEXT1664(auVar49);
              auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar87 = ZEXT3264(auVar50);
              uVar45 = uVar48 & 0xffffffff;
              auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar86 = ZEXT3264(auVar50);
              auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar85 = ZEXT3264(auVar50);
              auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar84 = ZEXT3264(auVar50);
              auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar83 = ZEXT3264(auVar50);
            }
            uVar39 = vptestmd_avx512vl(local_5ca0,local_5ca0);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar47 = (bool)((byte)uVar39 & 1);
            bVar8 = (bool)((byte)(uVar39 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar39 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar39 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar39 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar39 >> 5) & 1);
            bVar13 = (bool)((byte)(uVar39 >> 6) & 1);
            bVar14 = SUB81(uVar39 >> 7,0);
            *(uint *)(local_5cf0.ray + 0x100) =
                 (uint)bVar47 * auVar50._0_4_ | (uint)!bVar47 * *(int *)(local_5cf0.ray + 0x100);
            *(uint *)(local_5cf0.ray + 0x104) =
                 (uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * *(int *)(local_5cf0.ray + 0x104);
            *(uint *)(local_5cf0.ray + 0x108) =
                 (uint)bVar9 * auVar50._8_4_ | (uint)!bVar9 * *(int *)(local_5cf0.ray + 0x108);
            *(uint *)(local_5cf0.ray + 0x10c) =
                 (uint)bVar10 * auVar50._12_4_ | (uint)!bVar10 * *(int *)(local_5cf0.ray + 0x10c);
            *(uint *)(local_5cf0.ray + 0x110) =
                 (uint)bVar11 * auVar50._16_4_ | (uint)!bVar11 * *(int *)(local_5cf0.ray + 0x110);
            *(uint *)(local_5cf0.ray + 0x114) =
                 (uint)bVar12 * auVar50._20_4_ | (uint)!bVar12 * *(int *)(local_5cf0.ray + 0x114);
            *(uint *)(local_5cf0.ray + 0x118) =
                 (uint)bVar13 * auVar50._24_4_ | (uint)!bVar13 * *(int *)(local_5cf0.ray + 0x118);
            *(uint *)(local_5cf0.ray + 0x11c) =
                 (uint)bVar14 * auVar50._28_4_ | (uint)!bVar14 * *(int *)(local_5cf0.ray + 0x11c);
          }
          bVar36 = (byte)uVar39;
          bVar47 = (bool)((byte)(uVar39 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar39 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar39 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar39 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar39 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar39 >> 6) & 1);
          bVar13 = SUB81(uVar39 >> 7,0);
          *(uint *)local_5d18 =
               (uint)(bVar36 & 1) * *(int *)local_5d18 | (uint)!(bool)(bVar36 & 1) * local_5c60;
          *(uint *)(local_5d18 + 4) =
               (uint)bVar47 * *(int *)(local_5d18 + 4) | (uint)!bVar47 * iStack_5c5c;
          *(uint *)(local_5d18 + 8) =
               (uint)bVar8 * *(int *)(local_5d18 + 8) | (uint)!bVar8 * iStack_5c58;
          *(uint *)(local_5d18 + 0xc) =
               (uint)bVar9 * *(int *)(local_5d18 + 0xc) | (uint)!bVar9 * iStack_5c54;
          *(uint *)(local_5d18 + 0x10) =
               (uint)bVar10 * *(int *)(local_5d18 + 0x10) | (uint)!bVar10 * iStack_5c50;
          *(uint *)(local_5d18 + 0x14) =
               (uint)bVar11 * *(int *)(local_5d18 + 0x14) | (uint)!bVar11 * iStack_5c4c;
          *(uint *)(local_5d18 + 0x18) =
               (uint)bVar12 * *(int *)(local_5d18 + 0x18) | (uint)!bVar12 * iStack_5c48;
          *(uint *)(local_5d18 + 0x1c) =
               (uint)bVar13 * *(int *)(local_5d18 + 0x1c) | (uint)!bVar13 * iStack_5c44;
          uVar48 = uVar45;
        }
        bVar42 = (byte)local_5d40 & ~bVar36;
      }
      if ((bVar42 == 0) || (bVar47 = 2 < uVar44, uVar44 = uVar44 + 1, bVar47)) break;
    }
    local_5d59 = local_5d59 & bVar42;
    if (local_5d59 == 0) break;
  }
  bVar42 = ~local_5d59;
LAB_008732a9:
  bVar37 = bVar37 | bVar42;
  uVar45 = local_5d10;
  if (bVar37 == 0xff) {
LAB_008732d7:
    iVar38 = 3;
  }
  else {
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    bVar47 = (bool)(bVar37 >> 1 & 1);
    bVar8 = (bool)(bVar37 >> 2 & 1);
    bVar9 = (bool)(bVar37 >> 3 & 1);
    bVar10 = (bool)(bVar37 >> 4 & 1);
    bVar11 = (bool)(bVar37 >> 5 & 1);
    bVar12 = (bool)(bVar37 >> 6 & 1);
    local_5960._4_4_ = (uint)bVar47 * auVar50._4_4_ | (uint)!bVar47 * local_5960._4_4_;
    local_5960._0_4_ =
         (uint)(bVar37 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar37 & 1) * local_5960._0_4_;
    local_5960._8_4_ = (uint)bVar8 * auVar50._8_4_ | (uint)!bVar8 * local_5960._8_4_;
    local_5960._12_4_ = (uint)bVar9 * auVar50._12_4_ | (uint)!bVar9 * local_5960._12_4_;
    local_5960._16_4_ = (uint)bVar10 * auVar50._16_4_ | (uint)!bVar10 * local_5960._16_4_;
    local_5960._20_4_ = (uint)bVar11 * auVar50._20_4_ | (uint)!bVar11 * local_5960._20_4_;
    local_5960._24_4_ = (uint)bVar12 * auVar50._24_4_ | (uint)!bVar12 * local_5960._24_4_;
    local_5960._28_4_ =
         (uint)(bVar37 >> 7) * auVar50._28_4_ | (uint)!(bool)(bVar37 >> 7) * local_5960._28_4_;
    iVar38 = 0;
  }
LAB_008732da:
  if (iVar38 == 3) {
    bVar37 = bVar37 & (byte)uVar48;
    bVar47 = (bool)(bVar37 >> 1 & 1);
    bVar8 = (bool)(bVar37 >> 2 & 1);
    bVar9 = (bool)(bVar37 >> 3 & 1);
    bVar10 = (bool)(bVar37 >> 4 & 1);
    bVar11 = (bool)(bVar37 >> 5 & 1);
    bVar12 = (bool)(bVar37 >> 6 & 1);
    *(uint *)local_5d18 =
         (uint)(bVar37 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar37 & 1) * *(int *)local_5d18;
    *(uint *)(local_5d18 + 4) =
         (uint)bVar47 * auVar85._4_4_ | (uint)!bVar47 * *(int *)(local_5d18 + 4);
    *(uint *)(local_5d18 + 8) =
         (uint)bVar8 * auVar85._8_4_ | (uint)!bVar8 * *(int *)(local_5d18 + 8);
    *(uint *)(local_5d18 + 0xc) =
         (uint)bVar9 * auVar85._12_4_ | (uint)!bVar9 * *(int *)(local_5d18 + 0xc);
    *(uint *)(local_5d18 + 0x10) =
         (uint)bVar10 * auVar85._16_4_ | (uint)!bVar10 * *(int *)(local_5d18 + 0x10);
    *(uint *)(local_5d18 + 0x14) =
         (uint)bVar11 * auVar85._20_4_ | (uint)!bVar11 * *(int *)(local_5d18 + 0x14);
    *(uint *)(local_5d18 + 0x18) =
         (uint)bVar12 * auVar85._24_4_ | (uint)!bVar12 * *(int *)(local_5d18 + 0x18);
    *(uint *)(local_5d18 + 0x1c) =
         (uint)(bVar37 >> 7) * auVar85._28_4_ |
         (uint)!(bool)(bVar37 >> 7) * *(int *)(local_5d18 + 0x1c);
    return;
  }
  goto LAB_00872a8f;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }